

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
 __thiscall
spvtools::opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
          (ConvertToSampledImagePass *this,char *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer *__ptr;
  char *pcVar4;
  unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  descriptor_set_binding_pairs;
  uint32_t binding;
  uint32_t descriptor_set;
  vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
  *local_48;
  uint32_t local_40;
  uint32_t local_3c;
  DescriptorSetAndBinding local_38;
  
  if (str == (char *)0x0) {
    (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  }
  else {
    local_48 = (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
                *)operator_new(0x18);
    (local_48->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_48->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_48->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar4 = str + -1;
    do {
      pcVar3 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      iVar2 = isspace((int)*pcVar3);
    } while (iVar2 != 0);
    do {
      if (*pcVar4 == '\0') {
        (this->super_Pass)._vptr_Pass = (_func_int **)local_48;
        local_48 = (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
                    *)0x0;
        break;
      }
      local_3c = 0;
      pcVar3 = anon_unknown_18::ParseNumberUntilSeparator(pcVar4,&local_3c);
      if (pcVar3 == (char *)0x0) {
        (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
        pcVar4 = (char *)0x0;
LAB_0054dd37:
        bVar1 = false;
      }
      else {
        pcVar4 = pcVar3 + 1;
        if (*pcVar3 != ':') {
          (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
          goto LAB_0054dd37;
        }
        local_40 = 0;
        pcVar4 = anon_unknown_18::ParseNumberUntilSeparator(pcVar4,&local_40);
        bVar1 = pcVar4 != (char *)0x0;
        if (pcVar4 == (char *)0x0) {
          (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
          pcVar4 = (char *)0x0;
        }
        else {
          local_38.descriptor_set = local_3c;
          local_38.binding = local_40;
          std::
          vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
          ::emplace_back<spvtools::opt::DescriptorSetAndBinding>(local_48,&local_38);
          pcVar4 = pcVar4 + -1;
          do {
            pcVar3 = pcVar4 + 1;
            pcVar4 = pcVar4 + 1;
            iVar2 = isspace((int)*pcVar3);
          } while (iVar2 != 0);
        }
      }
    } while (bVar1);
    if (local_48 !=
        (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
         *)0x0) {
      std::
      default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
      ::operator()((default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
                    *)&local_48,local_48);
    }
  }
  return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VectorOfDescriptorSetAndBindingPairs>
ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
    const char* str) {
  if (!str) return nullptr;

  auto descriptor_set_binding_pairs =
      MakeUnique<VectorOfDescriptorSetAndBindingPairs>();

  while (std::isspace(*str)) str++;  // skip leading spaces.

  // The parsing loop, break when points to the end.
  while (*str) {
    // Parse the descriptor set.
    uint32_t descriptor_set = 0;
    str = ParseNumberUntilSeparator(str, &descriptor_set);
    if (str == nullptr) return nullptr;

    // Find the ':', spaces between the descriptor set and the ':' are not
    // allowed.
    if (*str++ != ':') {
      // ':' not found
      return nullptr;
    }

    // Parse the binding.
    uint32_t binding = 0;
    str = ParseNumberUntilSeparator(str, &binding);
    if (str == nullptr) return nullptr;

    descriptor_set_binding_pairs->push_back({descriptor_set, binding});

    // Skip trailing spaces.
    while (std::isspace(*str)) str++;
  }

  return descriptor_set_binding_pairs;
}